

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O0

bool density_tests::detail::
     PutTestObject<density::sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>,_2048UL,_2048UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  EasyRandom *this;
  sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
  *this_00;
  TestObject<2048UL,_2048UL> *i_source;
  void *i_source_00;
  sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  *this_01;
  int32_t iVar1;
  runtime_type<> rVar2;
  ulong uVar3;
  undefined8 in_RSI;
  undefined8 in_RDI;
  ElementType source;
  runtime_type<> type;
  
  uVar3 = (ulong)&stack0xfffffffffffffff8 & 0xfffffffffffff800;
  *(undefined8 *)(uVar3 - 0x18) = in_RDI;
  *(undefined8 *)(uVar3 - 0x20) = in_RSI;
  this = *(EasyRandom **)(uVar3 - 0x20);
  *(undefined8 *)(uVar3 - 0x2808) = 0x29ab6e7;
  iVar1 = EasyRandom::get_bool(this,0.9);
  if (iVar1 == 0) {
    *(undefined8 *)(uVar3 - 0x2808) = 0x29ab762;
    rVar2 = density::runtime_type<>::make<density_tests::TestObject<2048ul,2048ul>>();
    *(tuple_type **)(uVar3 - 0x1018) = rVar2.m_feature_table;
    *(TestObject<2048UL,_2048UL> **)(uVar3 - 0x2018) =
         (TestObject<2048UL,_2048UL> *)(uVar3 - 0x2000);
    *(undefined8 *)(uVar3 - 0x2808) = 0x29ab77f;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar3 - 0x2000));
    i_source_00 = *(void **)(uVar3 - 0x2018);
    this_01 = *(sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                **)(uVar3 - 0x18);
    *(undefined8 *)(uVar3 - 0x2808) = 0x29ab79c;
    density::
    sp_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_density::default_busy_wait>
    ::dyn_push_copy(this_01,(runtime_type *)(uVar3 - 0x1018),i_source_00);
    *(undefined8 *)(uVar3 - 0x2808) = 0x29ab7ab;
    TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar3 - 0x2000));
  }
  else {
    *(undefined8 *)(uVar3 - 0x2010) = *(undefined8 *)(uVar3 - 0x18);
    *(TestObject<2048UL,_2048UL> **)(uVar3 - 0x2008) =
         (TestObject<2048UL,_2048UL> *)(uVar3 - 0x1000);
    *(undefined8 *)(uVar3 - 0x2808) = 0x29ab711;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar3 - 0x1000));
    this_00 = *(sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
                **)(uVar3 - 0x2010);
    i_source = *(TestObject<2048UL,_2048UL> **)(uVar3 - 0x2008);
    *(undefined8 *)(uVar3 - 0x2808) = 0x29ab726;
    density::
    sp_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,density::default_busy_wait>
    ::push<density_tests::TestObject<2048ul,2048ul>>(this_00,i_source);
    *(undefined8 *)(uVar3 - 0x2808) = 0x29ab735;
    TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar3 - 0x1000));
  }
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }